

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

QRectF * __thiscall
QWidgetWindowPrivate::closestAcceptableGeometry
          (QRectF *__return_storage_ptr__,QWidgetWindowPrivate *this,QRectF *rect)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  QWidgetData *pQVar6;
  undefined1 auVar7 [16];
  qreal qVar8;
  qreal qVar9;
  char cVar10;
  QSize QVar11;
  undefined4 extraout_EDX;
  uint uVar12;
  QWidget *widget;
  long in_FS_OFFSET;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  qreal qVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  QSize oldSize;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(*(long *)&this->field_0x8 + 0x28);
  if ((lVar5 == 0) || (*(int *)(lVar5 + 4) == 0)) {
    widget = (QWidget *)0x0;
  }
  else {
    widget = *(QWidget **)(*(long *)&this->field_0x8 + 0x30);
  }
  if (((widget == (QWidget *)0x0) ||
      (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) ||
     (cVar10 = (**(code **)(*(long *)widget + 0x88))(widget), cVar10 == '\0')) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
      return __return_storage_ptr__;
    }
  }
  else {
    auVar17._0_8_ = (double)((ulong)rect->w & 0x8000000000000000 | 0x3fe0000000000000) + rect->w;
    auVar17._8_8_ = (double)((ulong)rect->h & 0x8000000000000000 | 0x3fe0000000000000) + rect->h;
    auVar17 = minpd(_DAT_0066f5d0,auVar17);
    auVar18._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
    auVar18._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
    uVar12 = movmskpd(extraout_EDX,auVar18);
    uVar14 = 0x8000000000000000;
    if ((uVar12 & 2) != 0) {
      uVar14 = (ulong)(uint)(int)auVar17._8_8_ << 0x20;
    }
    uVar13 = 0x80000000;
    if ((uVar12 & 1) != 0) {
      uVar13 = (ulong)(uint)(int)auVar17._0_8_;
    }
    local_30 = (QSize)(uVar13 | uVar14);
    QVar11 = QLayout::closestAcceptableSize(widget,&local_30);
    if (QVar11.ht.m_i.m_i == local_30.ht.m_i && QVar11.wd.m_i.m_i == local_30.wd.m_i) {
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
    }
    else {
      qVar19 = rect->xp;
      qVar8 = rect->yp;
      qVar9 = rect->h;
      __return_storage_ptr__->w = rect->w;
      __return_storage_ptr__->h = qVar9;
      __return_storage_ptr__->xp = qVar19;
      __return_storage_ptr__->yp = qVar8;
      pQVar6 = widget->data;
      iVar2 = (pQVar6->crect).x1.m_i;
      dVar16 = (double)iVar2;
      iVar3 = (pQVar6->crect).y1.m_i;
      dVar23 = (double)iVar3;
      iVar4 = (pQVar6->crect).x2.m_i;
      dVar1 = __return_storage_ptr__->yp;
      dVar20 = dVar1 + __return_storage_ptr__->h;
      dVar22 = dVar1 - dVar23;
      dVar23 = dVar20 - ((double)(((long)(pQVar6->crect).y2.m_i - (long)iVar3) + 1) + dVar23);
      uVar13 = -(ulong)(dVar22 < -dVar22);
      uVar15 = -(ulong)(dVar23 < -dVar23);
      uVar14 = (ulong)-dVar23 & uVar15;
      auVar21._0_8_ = ~uVar13 & (ulong)dVar22;
      auVar21._8_8_ = ~uVar15 & (ulong)dVar23;
      auVar7._8_4_ = (int)uVar14;
      auVar7._0_8_ = (ulong)-dVar22 & uVar13;
      auVar7._12_4_ = (int)(uVar14 >> 0x20);
      dVar23 = (double)(QVar11.ht.m_i.m_i - local_30.ht.m_i);
      if (SUB168(auVar21 | auVar7,0) <= SUB168(auVar21 | auVar7,8)) {
        qVar19 = (dVar20 + dVar23) - dVar1;
      }
      else {
        dVar23 = (dVar1 - dVar23) - dVar1;
        __return_storage_ptr__->yp = dVar1 + dVar23;
        qVar19 = __return_storage_ptr__->h - dVar23;
      }
      __return_storage_ptr__->h = qVar19;
      dVar1 = __return_storage_ptr__->xp;
      dVar22 = dVar1 + __return_storage_ptr__->w;
      dVar23 = dVar1 - dVar16;
      dVar16 = dVar22 - ((double)(((long)iVar4 - (long)iVar2) + 1) + dVar16);
      uVar14 = -(ulong)(dVar23 < -dVar23);
      uVar13 = -(ulong)(dVar16 < -dVar16);
      dVar20 = (double)(QVar11.wd.m_i.m_i - local_30.wd.m_i);
      if ((double)(~uVar14 & (ulong)dVar23 | (ulong)-dVar23 & uVar14) <=
          (double)(~uVar13 & (ulong)dVar16 | (ulong)-dVar16 & uVar13)) {
        __return_storage_ptr__->w = (dVar22 + dVar20) - dVar1;
      }
      else {
        dVar23 = (dVar1 - dVar20) - dVar1;
        __return_storage_ptr__->xp = dVar1 + dVar23;
        __return_storage_ptr__->w = __return_storage_ptr__->w - dVar23;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetWindowPrivate::closestAcceptableGeometry(const QRectF &rect) const
{
    Q_Q(const QWidgetWindow);
    const QWidget *widget = q->widget();
    if (!widget || !widget->isWindow() || !widget->hasHeightForWidth())
        return QRect();
    const QSize oldSize = rect.size().toSize();
    const QSize newSize = QLayout::closestAcceptableSize(widget, oldSize);
    if (newSize == oldSize)
        return QRectF();
    const int dw = newSize.width() - oldSize.width();
    const int dh = newSize.height() - oldSize.height();
    QRectF result = rect;
    const QRectF currentGeometry(widget->geometry());
    const qreal topOffset = result.top() - currentGeometry.top();
    const qreal bottomOffset = result.bottom() - currentGeometry.bottom();
    if (qAbs(topOffset) > qAbs(bottomOffset))
        result.setTop(result.top() - dh); // top edge drag
    else
        result.setBottom(result.bottom() + dh); // bottom edge drag
    const qreal leftOffset = result.left() - currentGeometry.left();
    const qreal rightOffset = result.right() - currentGeometry.right();
    if (qAbs(leftOffset) > qAbs(rightOffset))
        result.setLeft(result.left() - dw); // left edge drag
    else
        result.setRight(result.right() + dw); // right edge drag
    return result;
}